

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

void __thiscall flatbuffers::ToStringVisitor::Float(ToStringVisitor *this,float x)

{
  string local_30;
  
  FloatToString<float>(&local_30,x,6);
  std::__cxx11::string::_M_append((char *)&this->s,(ulong)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Float(float x) { s += NumToString(x); }